

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cell.c
# Opt level: O2

REF_STATUS ref_cell_deep_copy(REF_CELL *ref_cell_ptr,REF_CELL original)

{
  uint uVar1;
  REF_CELL ref_cell;
  REF_INT *pRVar2;
  int iVar3;
  undefined8 uVar4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  char *pcVar8;
  ulong uVar9;
  
  ref_cell = (REF_CELL)malloc(0x48);
  *ref_cell_ptr = ref_cell;
  if (ref_cell == (REF_CELL)0x0) {
    pcVar8 = "malloc *ref_cell_ptr of REF_CELL_STRUCT NULL";
    uVar4 = 0x1e4;
LAB_0011a4a7:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",uVar4,
           "ref_cell_deep_copy",pcVar8);
    uVar1 = 2;
  }
  else {
    uVar1 = ref_cell_initialize(ref_cell,original->type);
    if (uVar1 == 0) {
      iVar6 = original->max;
      ref_cell->n = original->n;
      ref_cell->max = iVar6;
      uVar1 = ref_cell->size_per;
      if ((int)(uVar1 * iVar6) < 0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",
               0x1ef,"ref_cell_deep_copy","malloc ref_cell->c2n of REF_INT negative");
        return 1;
      }
      pRVar2 = (REF_INT *)malloc((ulong)(uVar1 * iVar6) << 2);
      ref_cell->c2n = pRVar2;
      if (pRVar2 == (REF_INT *)0x0) {
        pcVar8 = "malloc ref_cell->c2n of REF_INT NULL";
        uVar4 = 0x1ef;
        goto LAB_0011a4a7;
      }
      iVar3 = 0;
      if (iVar6 < 1) {
        iVar6 = 0;
      }
      uVar5 = 0;
      if (0 < (int)uVar1) {
        uVar5 = (ulong)uVar1;
      }
      for (iVar7 = 0; iVar7 != iVar6; iVar7 = iVar7 + 1) {
        for (uVar9 = 0; uVar5 != uVar9; uVar9 = uVar9 + 1) {
          pRVar2[(long)iVar3 + uVar9] =
               original->c2n[(long)original->size_per * (long)iVar7 + uVar9];
        }
        iVar3 = iVar3 + uVar1;
      }
      ref_cell->blank = original->blank;
      uVar1 = ref_adj_deep_copy(&ref_cell->ref_adj,original->ref_adj);
      if (uVar1 == 0) {
        return 0;
      }
      pcVar8 = "deep copy ref_adj for ref_cell";
      uVar4 = 0x1f7;
    }
    else {
      pcVar8 = "init";
      uVar4 = 0x1e8;
    }
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",uVar4,
           "ref_cell_deep_copy",(ulong)uVar1,pcVar8);
  }
  return uVar1;
}

Assistant:

REF_FCN REF_STATUS ref_cell_deep_copy(REF_CELL *ref_cell_ptr,
                                      REF_CELL original) {
  REF_INT node, cell;
  REF_INT max;
  REF_CELL ref_cell;
  ref_malloc(*ref_cell_ptr, 1, REF_CELL_STRUCT);

  ref_cell = (*ref_cell_ptr);

  RSS(ref_cell_initialize(ref_cell, ref_cell_type(original)), "init");

  max = ref_cell_max(original);
  ref_cell_n(ref_cell) = ref_cell_n(original);
  ref_cell_max(ref_cell) = max;

  ref_malloc(ref_cell->c2n,
             ref_cell_max(ref_cell) * ref_cell_size_per(ref_cell), REF_INT);
  for (cell = 0; cell < max; cell++)
    for (node = 0; node < ref_cell_size_per(ref_cell); node++)
      ref_cell_c2n(ref_cell, node, cell) = ref_cell_c2n(original, node, cell);

  ref_cell_blank(ref_cell) = ref_cell_blank(original);

  RSS(ref_adj_deep_copy(&(ref_cell->ref_adj), original->ref_adj),
      "deep copy ref_adj for ref_cell");

  return REF_SUCCESS;
}